

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
* __thiscall SetInstance::representation_abi_cxx11_(SetInstance *this)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_RDI;
  iterator it;
  string elements_str;
  set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
  *this_00;
  string local_a0 [32];
  _Base_ptr local_80;
  string local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  string local_30 [48];
  
  this_00 = in_RDI;
  std::__cxx11::string::string(local_30);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
       ::begin(in_RDI);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
         ::end(in_RDI);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    local_48._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
         ::begin(in_RDI);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (bVar1) {
      std::__cxx11::string::operator+=(local_30,",");
    }
    std::_Rb_tree_const_iterator<std::shared_ptr<Instance>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<Instance>_> *)this_00);
    peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1c270c);
    (*peVar2->_vptr_Instance[2])(local_78);
    std::__cxx11::string::operator+=(local_30,local_78);
    std::__cxx11::string::~string(local_78);
    local_80 = (_Base_ptr)
               std::_Rb_tree_const_iterator<std::shared_ptr<Instance>_>::operator++
                         ((_Rb_tree_const_iterator<std::shared_ptr<Instance>_> *)in_RSI,
                          (int)((ulong)this_00 >> 0x20));
  }
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(in_RSI,(char *)this_00);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_30);
  return this_00;
}

Assistant:

std::string SetInstance::representation() const {
    std::string elements_str;
    for (auto it = _value.begin(); it != _value.end(); it++) {
        if (it != _value.begin())
            elements_str += ",";
        elements_str += (*it)->representation();
    }
    return "{" + elements_str + "}";
}